

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesAttGroupInfo.hpp
# Opt level: O1

void __thiscall
xercesc_4_0::XercesAttGroupInfo::addAttDef
          (XercesAttGroupInfo *this,SchemaAttDef *toAdd,bool toClone)

{
  MemoryManager *pMVar1;
  BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *this_00;
  XMLSize_t XVar2;
  int iVar3;
  XMLSize_t index;
  RefVectorOf<xercesc_4_0::SchemaAttDef> *pRVar4;
  undefined4 extraout_var;
  long lVar5;
  SchemaAttDef *this_01;
  
  if (this->fAttributes == (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    pRVar4 = (RefVectorOf<xercesc_4_0::SchemaAttDef> *)
             XMemory::operator_new(0x30,this->fMemoryManager);
    pMVar1 = this->fMemoryManager;
    (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>)._vptr_BaseRefVectorOf =
         (_func_int **)&PTR__BaseRefVectorOf_004163c8;
    (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).fAdoptedElems = true;
    (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).fCurCount = 0;
    (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).fMaxCount = 4;
    (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).fElemList = (SchemaAttDef **)0x0;
    (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).fMemoryManager = pMVar1;
    iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x20);
    (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).fElemList =
         (SchemaAttDef **)CONCAT44(extraout_var,iVar3);
    lVar5 = 0;
    do {
      (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).fElemList[lVar5] =
           (SchemaAttDef *)0x0;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>)._vptr_BaseRefVectorOf =
         (_func_int **)&PTR__RefVectorOf_00416350;
    this->fAttributes = pRVar4;
  }
  this_01 = toAdd;
  if (toClone) {
    this_01 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fMemoryManager);
    SchemaAttDef::SchemaAttDef(this_01,toAdd);
    if (this_01->fBaseAttDecl == (SchemaAttDef *)0x0) {
      this_01->fBaseAttDecl = toAdd;
    }
  }
  this_00 = &this->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>;
  BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::ensureExtraCapacity(this_00,1);
  XVar2 = this_00->fCurCount;
  this_00->fElemList[XVar2] = this_01;
  this_00->fCurCount = XVar2 + 1;
  return;
}

Assistant:

inline void XercesAttGroupInfo::addAttDef(SchemaAttDef* const toAdd,
                                             const bool toClone) {

    if (!fAttributes) {
        fAttributes = new (fMemoryManager) RefVectorOf<SchemaAttDef>(4, true, fMemoryManager);
    }

    if (toClone) {
        SchemaAttDef* clonedAttDef = new (fMemoryManager) SchemaAttDef(toAdd);

        if (!clonedAttDef->getBaseAttDecl())
            clonedAttDef->setBaseAttDecl(toAdd);

        fAttributes->addElement(clonedAttDef);
    }
    else {
        fAttributes->addElement(toAdd);
    }
}